

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O2

void __thiscall
chrono::ChVisualShapeFEA::ChVisualShapeFEA
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChMesh> *fea_mesh)

{
  undefined8 uVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined4 uVar6;
  undefined1 auVar5 [16];
  __shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2> local_20;
  undefined1 auVar4 [16];
  
  uVar6 = 0x3f800000;
  uVar3 = 0x3f8000003f800000;
  auVar4._8_4_ = uVar6;
  auVar4._0_8_ = uVar3;
  auVar4._12_4_ = 0x3f800000;
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->FEMmesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->meshcolor).R = (float)(int)uVar3;
  (this->meshcolor).G = (float)SUB84(uVar3,4);
  (this->meshcolor).B = (float)uVar6;
  (this->symbolscolor).R = 1.0;
  uVar1 = vmovlps_avx(auVar4);
  (this->symbolscolor).G = (float)(int)uVar1;
  (this->symbolscolor).B = (float)(int)((ulong)uVar1 >> 0x20);
  auVar2 = ZEXT432(0) << 0x40;
  this->m_trimesh_shape = (shared_ptr<chrono::ChTriangleMeshShape>)auVar2._0_16_;
  this->m_glyphs_shape = (shared_ptr<chrono::ChGlyphs>)auVar2._16_16_;
  *(undefined1 (*) [32])
   &(this->m_glyphs_shape).super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = auVar2;
  std::__shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2> *)this,
             &fea_mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>);
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  this->fem_data_type = SURFACE;
  this->fem_glyph = NONE;
  this->shrink_elements = false;
  this->shrink_factor = 0.9;
  this->colorscale_min = 0.0;
  this->colorscale_max = 1.0;
  this->symbols_scale = 1.0;
  this->symbols_thickness = 0.002;
  this->wireframe = false;
  this->backface_cull = false;
  this->zbuffer_hide = true;
  this->smooth_faces = false;
  this->beam_resolution = 8;
  this->beam_resolution_section = 10;
  this->shell_resolution = 3;
  (this->meshcolor).R = 1.0;
  (this->meshcolor).G = 1.0;
  *(undefined8 *)&(this->meshcolor).B = 0x3f800000;
  uVar1 = vmovlps_avx(auVar5);
  (this->symbolscolor).G = (float)(int)uVar1;
  (this->symbolscolor).B = (float)(int)((ulong)uVar1 >> 0x20);
  this->undeformed_reference = false;
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  std::__shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_trimesh_shape).
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  chrono_types::make_shared<chrono::ChGlyphs,_0>();
  std::__shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_glyphs_shape).
              super___shared_ptr<chrono::ChGlyphs,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChVisualShapeFEA::ChVisualShapeFEA(std::shared_ptr<fea::ChMesh> fea_mesh) {
    FEMmesh = fea_mesh;
    fem_data_type = DataType::SURFACE;
    fem_glyph = GlyphType::NONE;

    colorscale_min = 0;
    colorscale_max = 1;

    shrink_elements = false;
    shrink_factor = 0.9;

    symbols_scale = 1.0;
    symbols_thickness = 0.002;

    wireframe = false;
    backface_cull = false;

    zbuffer_hide = true;

    smooth_faces = false;

    beam_resolution = 8;
    beam_resolution_section = 10;
    shell_resolution = 3;

    meshcolor = ChColor(1, 1, 1);
    symbolscolor = ChColor(0, 0.5, 0.5);

    undeformed_reference = false;

    m_trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    m_glyphs_shape = chrono_types::make_shared<ChGlyphs>();
}